

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpserver.c
# Opt level: O0

void print_usage(char *prg)

{
  undefined8 in_RDI;
  
  fprintf(_stderr,"\nUsage: %s -l <port> -s <can_id> -d <can_id> [options] <CAN interface>\n",in_RDI
         );
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,"ip addressing:\n");
  fprintf(_stderr,"         -l <port>    * (local port for the server)\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"isotp addressing:\n");
  fprintf(_stderr,"         -s <can_id>  * (source can_id. Use 8 digits for extended IDs)\n");
  fprintf(_stderr,"         -d <can_id>  * (destination can_id. Use 8 digits for extended IDs)\n");
  fprintf(_stderr,"         -x <addr>[:<rxaddr>]  (extended addressing / opt. separate rxaddr)\n");
  fprintf(_stderr,"         -L <mtu>:<tx_dl>:<tx_flags>  (link layer options for CAN FD)\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"padding:\n");
  fprintf(_stderr,"         -p [tx]:[rx]  (set and enable tx/rx padding bytes)\n");
  fprintf(_stderr,"         -P <mode>     (check rx padding for (l)ength (c)ontent (a)ll)\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"rx path:\n (config, which is sent to the sender / data source)\n");
  fprintf(_stderr,"         -b <bs>       (blocksize. 0 = off)\n");
  fprintf(_stderr,"         -m <val>      (STmin in ms/ns. See spec.)\n");
  fprintf(_stderr,"         -w <num>      (max. wait frame transmissions)\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"tx path:\n (config, which changes local tx settings)\n");
  fprintf(_stderr,"         -t <time ns>  (transmit time in nanosecs)\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"(* = mandatory option)\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"All values except for \'-l\' and \'-t\' are expected in hexadecimal values.\n");
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void print_usage(char *prg)
{
	fprintf(stderr, "\nUsage: %s -l <port> -s <can_id> -d <can_id> [options] <CAN interface>\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "ip addressing:\n");
	fprintf(stderr, "         -l <port>    * (local port for the server)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "isotp addressing:\n");
	fprintf(stderr, "         -s <can_id>  * (source can_id. Use 8 digits for extended IDs)\n");
	fprintf(stderr, "         -d <can_id>  * (destination can_id. Use 8 digits for extended IDs)\n");
	fprintf(stderr, "         -x <addr>[:<rxaddr>]  (extended addressing / opt. separate rxaddr)\n");
	fprintf(stderr, "         -L <mtu>:<tx_dl>:<tx_flags>  (link layer options for CAN FD)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "padding:\n");
	fprintf(stderr, "         -p [tx]:[rx]  (set and enable tx/rx padding bytes)\n");
	fprintf(stderr, "         -P <mode>     (check rx padding for (l)ength (c)ontent (a)ll)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "rx path:\n (config, which is sent to the sender / data source)\n");
	fprintf(stderr, "         -b <bs>       (blocksize. 0 = off)\n");
	fprintf(stderr, "         -m <val>      (STmin in ms/ns. See spec.)\n");
	fprintf(stderr, "         -w <num>      (max. wait frame transmissions)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "tx path:\n (config, which changes local tx settings)\n");
	fprintf(stderr, "         -t <time ns>  (transmit time in nanosecs)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "(* = mandatory option)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "All values except for '-l' and '-t' are expected in hexadecimal values.\n");
	fprintf(stderr, "\n");
}